

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerWalFrames(Pager *pPager,PgHdr *pList,Pgno nTruncate,int isCommit)

{
  byte bVar1;
  u32 uVar2;
  uint uVar3;
  Wal *pWal;
  u32 *puVar4;
  PgHdr *pPage;
  _func_int_sqlite3_file_ptr *p_Var5;
  bool bVar6;
  Pager *pPVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint *p;
  u32 uVar14;
  PgHdr **ppPVar15;
  long lVar16;
  Pgno nTruncate_00;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  PgHdr *pPVar21;
  long lVar22;
  u32 uVar23;
  int iVar24;
  long in_FS_OFFSET;
  bool bVar25;
  WalWriter w;
  u8 aFrame [24];
  int local_e0;
  ulong local_c8;
  PgHdr *local_b0;
  PgHdr *local_a8;
  long local_a0;
  sqlite3_file *local_98;
  uint *local_90;
  long local_88;
  Pager *local_80;
  WalWriter local_78;
  u32 local_58 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = pList;
  if (isCommit == 0) {
    iVar9 = 1;
  }
  else {
    iVar9 = 0;
    if (pList != (PgHdr *)0x0) {
      ppPVar15 = &local_a8;
      do {
        if (pList->pgno <= nTruncate) {
          ppPVar15 = &pList->pDirty;
        }
        iVar9 = iVar9 + (uint)(pList->pgno <= nTruncate);
        pList = pList->pDirty;
        *ppPVar15 = pList;
      } while (pList != (PgHdr *)0x0);
    }
  }
  pPVar21 = local_a8;
  pPager->aStat[2] = pPager->aStat[2] + iVar9;
  if (local_a8->pgno == 1) {
    pager_write_changecounter(local_a8);
  }
  pWal = pPager->pWal;
  uVar2 = pPager->pageSize;
  bVar1 = pPager->walSyncFlags;
  uVar10 = (uint)bVar1;
  puVar4 = *pWal->apWiData;
  local_80 = pPager;
  iVar11 = bcmp(&pWal->hdr,puVar4,0x30);
  iVar9 = 0;
  uVar12 = 0;
  if (iVar11 != 0) {
    uVar12 = puVar4[4] + 1;
  }
  if (pWal->readLock == 0) {
    if (puVar4[0x18] != 0) {
      sqlite3_randomness(4,&local_78);
      iVar9 = 0;
      if (pWal->exclusiveMode == '\0') {
        iVar9 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
      }
      if (iVar9 != 5) {
        if (iVar9 != 0) goto LAB_00200401;
        walRestartHdr(pWal,(u32)local_78.pWal);
        if (pWal->exclusiveMode == '\0') {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
        }
      }
    }
    if (pWal->exclusiveMode == '\0') {
      (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,5);
    }
    pWal->readLock = -1;
    iVar11 = 1;
    do {
      iVar9 = walTryBeginRead(pWal,(int *)&local_78,1,iVar11);
      iVar11 = iVar11 + 1;
    } while (iVar9 == -1);
  }
LAB_00200401:
  if (iVar9 != 0) goto LAB_00200405;
  uVar3 = (pWal->hdr).mxFrame;
  local_c8 = (ulong)uVar3;
  if (local_c8 == 0) {
    local_78.pWal = (Wal *)0x18e22d0082067f37;
    uVar17 = pWal->nCkpt;
    local_78.pFd = (sqlite3_file *)
                   CONCAT44(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                            uVar17 << 0x18,
                            CONCAT13((char)uVar2,
                                     CONCAT12((char)(uVar2 >> 8),
                                              CONCAT11((char)(uVar2 >> 0x10),(char)(uVar2 >> 0x18)))
                                    ));
    if (uVar17 == 0) {
      sqlite3_randomness(8,(pWal->hdr).aSalt);
    }
    local_78.iSyncPoint = *(long *)(pWal->hdr).aSalt;
    uVar23 = 0;
    uVar18 = 0xfffffffffffffff8;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + uVar23 + *(int *)((long)local_58 + (uVar18 - 0x18));
      uVar23 = uVar23 + *(int *)((long)local_58 + (uVar18 - 0x14)) + uVar14;
      uVar18 = uVar18 + 8;
    } while (uVar18 < 0x10);
    local_78.syncFlags =
         CONCAT13((char)uVar14,
                  CONCAT12((char)(uVar14 >> 8),
                           CONCAT11((char)(uVar14 >> 0x10),(char)(uVar14 >> 0x18))));
    local_78.szPage =
         CONCAT13((char)uVar23,
                  CONCAT12((char)(uVar23 >> 8),
                           CONCAT11((char)(uVar23 >> 0x10),(char)(uVar23 >> 0x18))));
    pWal->szPage = uVar2;
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).aFrameCksum[0] = uVar14;
    (pWal->hdr).aFrameCksum[1] = uVar23;
    pWal->truncateOnCommit = '\x01';
    iVar11 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&local_78,0x20,0);
    if ((iVar11 == 0) &&
       (((uVar10 == 0 || (pWal->syncHeader == '\0')) ||
        (iVar11 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,uVar10 & 0x13), iVar11 == 0)))) {
      iVar11 = 0;
      bVar25 = true;
    }
    else {
      iVar9 = iVar11;
      bVar25 = false;
      iVar11 = iVar9;
    }
    local_e0 = iVar9;
    if (!bVar25) goto LAB_00200405;
  }
  else {
    iVar11 = 0;
  }
  local_98 = pWal->pWalFd;
  local_78.iSyncPoint = 0;
  lVar19 = (long)(int)(uVar2 + 0x18);
  lVar16 = local_c8 * lVar19 + 0x20;
  local_b0 = (PgHdr *)0x0;
  local_78.pWal = pWal;
  local_78.szPage = uVar2;
  local_78.syncFlags = uVar10;
  local_78.pFd = local_98;
  iVar20 = local_e0;
  for (pPage = pPVar21; pPage != (PgHdr *)0x0; pPage = pPage->pDirty) {
    local_e0 = iVar20;
    if ((uVar12 == 0) || ((isCommit != 0 && (pPage->pDirty == (PgHdr *)0x0)))) {
LAB_002006c1:
      if (isCommit == 0) {
        nTruncate_00 = 0;
      }
      else {
        nTruncate_00 = 0;
        if (pPage->pDirty == (PgHdr *)0x0) {
          nTruncate_00 = nTruncate;
        }
      }
      local_c8 = (ulong)((int)local_c8 + 1);
      iVar11 = walWriteOneFrame(&local_78,pPage,nTruncate_00,lVar16);
      bVar25 = iVar11 == 0;
      iVar9 = iVar11;
      if (bVar25) {
        *(byte *)&pPage->flags = (byte)pPage->flags | 0x40;
        lVar16 = lVar16 + lVar19;
        iVar11 = 0;
        iVar9 = local_e0;
        local_b0 = pPage;
      }
      local_e0 = iVar9;
      bVar25 = !bVar25;
    }
    else {
      local_58[0] = 0;
      sqlite3WalFindFrame(pWal,pPage->pgno,local_58);
      uVar23 = local_58[0];
      bVar25 = false;
      if (uVar12 <= local_58[0]) {
        if (local_58[0] <= pWal->iReCksum - 1) {
          pWal->iReCksum = local_58[0];
        }
        iVar11 = (*pWal->pWalFd->pMethods->xWrite)
                           (pWal->pWalFd,pPage->pData,uVar2,(ulong)(local_58[0] - 1) * lVar19 + 0x38
                           );
        bVar25 = true;
        local_e0 = iVar11;
        if (iVar11 == 0) {
          *(byte *)&pPage->flags = (byte)pPage->flags & 0xbf;
          bVar25 = false;
          local_e0 = iVar20;
        }
      }
      if (uVar23 < uVar12) goto LAB_002006c1;
    }
    iVar9 = local_e0;
    if (bVar25) goto LAB_00200405;
    uVar3 = (uint)local_c8;
    iVar20 = local_e0;
  }
  if ((isCommit != 0) && (pWal->iReCksum != 0)) {
    lVar22 = (long)(int)pWal->szPage + 0x18;
    iVar11 = (int)lVar22;
    local_a0 = lVar16;
    p = (uint *)sqlite3_malloc(iVar11);
    if (p == (uint *)0x0) {
      iVar9 = 7;
    }
    else {
      lVar16 = 0x18;
      if (pWal->iReCksum != 1) {
        lVar16 = (ulong)(pWal->iReCksum - 2) * lVar22 + 0x30;
      }
      iVar9 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,8,lVar16);
      uVar12 = *p;
      (pWal->hdr).aFrameCksum[0] =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      uVar12 = p[1];
      (pWal->hdr).aFrameCksum[1] =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      uVar12 = pWal->iReCksum;
      pWal->iReCksum = 0;
      if (uVar12 <= uVar3 && iVar9 == 0) {
        local_88 = (long)iVar11;
        local_90 = p + 6;
        do {
          lVar16 = (ulong)(uVar12 - 1) * local_88 + 0x20;
          iVar9 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,iVar11,lVar16);
          if (iVar9 == 0) {
            uVar17 = *p;
            uVar13 = p[1];
            walEncodeFrame(pWal,uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                                uVar17 << 0x18,
                           uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                           uVar13 << 0x18,(u8 *)local_90,(u8 *)local_58);
            iVar9 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,local_58,0x18,lVar16);
          }
        } while ((uVar12 + 1 <= uVar3) && (uVar12 = uVar12 + 1, iVar9 == 0));
      }
      sqlite3_free(p);
    }
    if (iVar9 != 0) goto LAB_00200405;
    iVar11 = 0;
    lVar16 = local_a0;
  }
  iVar24 = 0;
  if ((bVar1 & 0x20) != 0 && isCommit != 0) {
    if (pWal->padToSectorBoundary == '\0') {
      bVar25 = true;
      iVar24 = 0;
LAB_002009ad:
      bVar6 = true;
      if (bVar25) {
        iVar11 = (*local_98->pMethods->xSync)(local_98,uVar10 & 0x13);
      }
    }
    else {
      p_Var5 = pWal->pWalFd->pMethods->xSectorSize;
      if (p_Var5 == (_func_int_sqlite3_file_ptr *)0x0) {
        uVar12 = 0x1000;
      }
      else {
        uVar12 = (*p_Var5)(pWal->pWalFd);
      }
      uVar17 = 0x10000;
      if ((int)uVar12 < 0x10000) {
        uVar17 = uVar12;
      }
      uVar13 = 0x200;
      if (0x1f < (int)uVar12) {
        uVar13 = uVar17;
      }
      lVar22 = lVar16 + (ulong)uVar13 + -1;
      lVar22 = lVar22 - lVar22 % (long)(ulong)uVar13;
      iVar24 = 0;
      bVar25 = lVar22 == lVar16;
      bVar6 = !bVar25 && lVar16 <= lVar22;
      iVar9 = iVar20;
      local_78.iSyncPoint = lVar22;
      if ((lVar16 < lVar22) &&
         (local_a0 = lVar16, iVar11 = walWriteOneFrame(&local_78,local_b0,nTruncate,lVar16),
         iVar9 = iVar11, iVar11 == 0)) {
        iVar8 = 1;
        lVar16 = local_a0;
        do {
          iVar24 = iVar8;
          lVar16 = lVar16 + lVar19;
          bVar6 = lVar16 < lVar22;
          if (lVar22 <= lVar16) {
            iVar11 = 0;
            iVar9 = iVar20;
            break;
          }
          iVar11 = walWriteOneFrame(&local_78,local_b0,nTruncate,lVar16);
          iVar9 = iVar11;
          iVar8 = iVar24 + 1;
        } while (iVar11 == 0);
      }
      iVar20 = iVar9;
      if (!bVar6) goto LAB_002009ad;
      bVar6 = false;
    }
    iVar9 = iVar20;
    if (!bVar6) goto LAB_00200405;
  }
  if (((isCommit != 0) && (pWal->truncateOnCommit != '\0')) &&
     (lVar16 = pWal->mxWalSize, -1 < lVar16)) {
    lVar19 = (ulong)(uVar3 + iVar24) * lVar19 + 0x20;
    if (lVar19 <= lVar16) {
      lVar19 = lVar16;
    }
    walLimitSize(pWal,lVar19);
    pWal->truncateOnCommit = '\0';
  }
  uVar23 = (pWal->hdr).mxFrame;
  while ((pPVar21 != (PgHdr *)0x0 && (iVar11 == 0))) {
    iVar11 = 0;
    if ((pPVar21->flags & 0x40) != 0) {
      uVar23 = uVar23 + 1;
      iVar11 = walIndexAppend(pWal,uVar23,pPVar21->pgno);
    }
    pPVar21 = pPVar21->pDirty;
  }
  bVar25 = iVar11 == 0;
  if ((bVar25) && (0 < iVar24)) {
    do {
      uVar23 = uVar23 + 1;
      iVar11 = walIndexAppend(pWal,uVar23,local_b0->pgno);
      bVar25 = iVar11 == 0;
      if (!bVar25) break;
      bVar6 = 1 < iVar24;
      iVar24 = iVar24 + -1;
    } while (bVar6);
  }
  iVar9 = iVar11;
  if (bVar25) {
    (pWal->hdr).szPage = (ushort)(uVar2 >> 0x10) | (ushort)uVar2 & 0xff00;
    (pWal->hdr).mxFrame = uVar23;
    if (isCommit != 0) {
      puVar4 = &(pWal->hdr).iChange;
      *puVar4 = *puVar4 + 1;
      (pWal->hdr).nPage = nTruncate;
      walIndexWriteHdr(pWal);
      pWal->iCallback = uVar23;
    }
  }
LAB_00200405:
  pPVar7 = local_80;
  if ((iVar9 == 0) &&
     (pPVar21 = local_a8, local_a8 != (PgHdr *)0x0 && local_80->pBackup != (sqlite3_backup *)0x0)) {
    do {
      if (pPVar7->pBackup != (sqlite3_backup *)0x0) {
        backupUpdate(pPVar7->pBackup,pPVar21->pgno,(u8 *)pPVar21->pData);
      }
      pPVar21 = pPVar21->pDirty;
    } while (pPVar21 != (PgHdr *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar9;
  }
  __stack_chk_fail();
}

Assistant:

static int pagerWalFrames(
  Pager *pPager,                  /* Pager object */
  PgHdr *pList,                   /* List of frames to log */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit                    /* True if this is a commit */
){
  int rc;                         /* Return code */
  int nList;                      /* Number of pages in pList */
  PgHdr *p;                       /* For looping over pages */

  assert( pPager->pWal );
  assert( pList );
#ifdef SQLITE_DEBUG
  /* Verify that the page list is in accending order */
  for(p=pList; p && p->pDirty; p=p->pDirty){
    assert( p->pgno < p->pDirty->pgno );
  }
#endif

  assert( pList->pDirty==0 || isCommit );
  if( isCommit ){
    /* If a WAL transaction is being committed, there is no point in writing
    ** any pages with page numbers greater than nTruncate into the WAL file.
    ** They will never be read by any client. So remove them from the pDirty
    ** list here. */
    PgHdr **ppNext = &pList;
    nList = 0;
    for(p=pList; (*ppNext = p)!=0; p=p->pDirty){
      if( p->pgno<=nTruncate ){
        ppNext = &p->pDirty;
        nList++;
      }
    }
    assert( pList );
  }else{
    nList = 1;
  }
  pPager->aStat[PAGER_STAT_WRITE] += nList;

  if( pList->pgno==1 ) pager_write_changecounter(pList);
  rc = sqlite3WalFrames(pPager->pWal, 
      pPager->pageSize, pList, nTruncate, isCommit, pPager->walSyncFlags
  );
  if( rc==SQLITE_OK && pPager->pBackup ){
    for(p=pList; p; p=p->pDirty){
      sqlite3BackupUpdate(pPager->pBackup, p->pgno, (u8 *)p->pData);
    }
  }

#ifdef SQLITE_CHECK_PAGES
  pList = sqlite3PcacheDirtyList(pPager->pPCache);
  for(p=pList; p; p=p->pDirty){
    pager_set_pagehash(p);
  }
#endif

  return rc;
}